

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void Sparc_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  MCInst *mci_local;
  char *insn_asm_local;
  cs_insn *insn_local;
  csh ud_local;
  
  if ((*(int *)(ud + 0x68) == 3) && (insn->id == 0x1c)) {
    (insn->detail->field_6).x86.disp = 3;
    *(char *)((long)&insn->detail->field_6 + 0x10) = (char)(insn->detail->field_6).x86.sib_index;
    (insn->detail->field_6).arm64.operands[0].shift.type = ARM64_SFT_INVALID;
  }
  return;
}

Assistant:

void Sparc_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	if (((cs_struct *)ud)->detail != CS_OPT_ON)
		return;

	// fix up some instructions
	if (insn->id == SPARC_INS_CASX) {
		// first op is actually a memop, not regop
		insn->detail->sparc.operands[0].type = SPARC_OP_MEM;
		insn->detail->sparc.operands[0].mem.base = insn->detail->sparc.operands[0].reg;
		insn->detail->sparc.operands[0].mem.disp = 0;
	}
}